

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_utils.cc
# Opt level: O3

void __thiscall
lf::base::LineFeedFormatter::format(LineFeedFormatter *this,log_msg *msg,memory_buf_t *dest)

{
  formatter *pfVar1;
  string_view_t msg_00;
  level_enum lVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  log_msg part;
  log_msg empty_msg;
  log_msg local_1b0 [3];
  log_msg local_90;
  
  pcVar4 = (msg->payload).data_;
  sVar3 = (msg->payload).size_;
  uVar5 = 0xfffffffe;
  pcVar6 = pcVar4;
  pcVar7 = pcVar4;
  pcVar8 = pcVar4;
  do {
    if ((pcVar7 == pcVar4 + sVar3) || (*pcVar7 == '\n')) {
      if (uVar5 == 0xfffffffe) {
        uVar5 = 0xffffffff;
      }
      else if (uVar5 == 0xffffffff) {
        local_1b0[0].level = trace;
        local_1b0[0]._20_4_ = 0;
        local_1b0[0].logger_name.data_ = (char *)&PTR_grow_003f2b18;
        local_1b0[0].logger_name.size_ = (size_t)&local_1b0[0].thread_id;
        local_1b0[0].time.__d.__r = (duration)0xfa;
        spdlog::details::log_msg::log_msg
                  (&local_90,(time_point)(msg->time).__d.__r,msg->source,msg->logger_name,msg->level
                   ,(string_view_t)ZEXT816(0));
        pfVar1 = (this->wrapped_formatter_)._M_t.
                 super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>
                 .super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
        (*pfVar1->_vptr_formatter[2])(pfVar1,&local_90,local_1b0);
        lVar2 = local_1b0[0].level;
        if ((size_t *)local_1b0[0].logger_name.size_ != &local_1b0[0].thread_id) {
          operator_delete((void *)local_1b0[0].logger_name.size_,(ulong)local_1b0[0].time.__d.__r);
        }
        uVar5 = lVar2 - debug;
      }
      msg_00.size_ = (long)pcVar8 - (long)pcVar6;
      msg_00.data_ = pcVar6;
      spdlog::details::log_msg::log_msg
                (local_1b0,(time_point)(msg->time).__d.__r,msg->source,msg->logger_name,msg->level,
                 msg_00);
      sVar3 = (dest->super_buffer<char>).size_;
      pfVar1 = (this->wrapped_formatter_)._M_t.
               super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>.
               _M_t.
               super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
               super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
      (*pfVar1->_vptr_formatter[2])(pfVar1,local_1b0,dest);
      if (0 < (int)uVar5) {
        memset((dest->super_buffer<char>).ptr_ + sVar3,0x20,(ulong)uVar5);
      }
      pcVar4 = (msg->payload).data_;
      sVar3 = (msg->payload).size_;
      if (pcVar7 == pcVar4 + sVar3) {
        return;
      }
      pcVar6 = pcVar7 + 1;
    }
    pcVar7 = pcVar7 + 1;
    pcVar8 = pcVar8 + 1;
  } while( true );
}

Assistant:

void LineFeedFormatter::format(const spdlog::details::log_msg& msg,
                               spdlog::memory_buf_t& dest) {
  int offset = -2;  // -2: first line, // -1 second line
  const auto* begin = msg.payload.begin();

  for (const auto* it = msg.payload.begin();; ++it) {
    if (it == msg.payload.end() || *it == '\n') {
      if (offset == -2) {
        ++offset;
      } else if (offset == -1) {
        // the log message has more than one line
        // => determine the offset
        spdlog::memory_buf_t temp_dest;
        const spdlog::details::log_msg empty_msg(msg.time, msg.source,
                                                 msg.logger_name, msg.level,
                                                 spdlog::string_view_t());
        wrapped_formatter_->format(empty_msg, temp_dest);
        offset = static_cast<int>(temp_dest.size() - 1);
      }

      const spdlog::details::log_msg part(
          msg.time, msg.source, msg.logger_name, msg.level,
          spdlog::string_view_t(begin, it - begin));

      auto old_end = dest.size();
      wrapped_formatter_->format(part, dest);

      if (offset > 0) {
        std::memset(dest.data() + old_end, ' ', offset);
      }

      if (it == msg.payload.end()) {
        break;
      }
      begin = it + 1;
    }
  }
}